

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  pointer pcVar1;
  uint uVar2;
  char *in_R8;
  string local_68;
  undefined1 local_48 [8];
  string counts;
  
  if (FLAGS_gtest_print_time == '\x01') {
    uVar2 = TestCase::test_to_run_count(test_case);
    FormatCountableNoun_abi_cxx11_
              ((string *)local_48,(testing *)(ulong)uVar2,0x145a9f,"tests",in_R8);
    ColoredPrintf(COLOR_GREEN,"[----------] ");
    pcVar1 = (test_case->name_)._M_dataplus._M_p;
    counts.field_2._8_8_ = test_case->elapsed_time_;
    StreamableToString<long_long>(&local_68,(longlong *)(counts.field_2._M_local_buf + 8));
    printf("%s from %s (%s ms total)\n\n",local_48,pcVar1,local_68._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_68);
    fflush(_stdout);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  const std::string counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case.name(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}